

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_file.c
# Opt level: O2

int log_policy_stream_file_create(log_policy policy,log_policy_ctor ctor)

{
  undefined8 *instance;
  FILE *pFVar1;
  
  instance = (undefined8 *)malloc(8);
  if (instance != (undefined8 *)0x0) {
    pFVar1 = fopen(*ctor,*(char **)((long)ctor + 8));
    *instance = pFVar1;
    log_policy_instantiate(policy,instance,0);
  }
  return (uint)(instance == (undefined8 *)0x0);
}

Assistant:

static int log_policy_stream_file_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_stream_file_data file_data = malloc(sizeof(struct log_policy_stream_file_data_type));

	const log_policy_stream_file_ctor file_ctor = ctor;

	if (file_data == NULL)
	{
		return 1;
	}

	file_data->file = fopen(file_ctor->file_name, file_ctor->mode);

	log_policy_instantiate(policy, file_data, LOG_POLICY_STREAM_FILE);

	return 0;
}